

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
findOrInsert<void_const*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *this,void **key)

{
  void **key_00;
  void *pvVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  Node<const_void_*,_(anonymous_namespace)::Data> *pNVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  size_t index;
  size_t numBuckets;
  long lVar12;
  long in_FS_OFFSET;
  R_conflict2 RVar13;
  Bucket local_58;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (Bucket)ZEXT816(0);
  uVar7 = *(ulong *)(this + 0x10);
  uVar6 = ((*(ulong *)(this + 0x18) ^ (ulong)*key) >> 0x20 ^ *(ulong *)(this + 0x18) ^ (ulong)*key)
          * -0x2917014799a6026d;
  uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
  uVar6 = uVar6 >> 0x20 ^ uVar6;
  if (uVar7 != 0) {
    local_58 = findBucketWithHash<void_const*>(this,key,uVar6);
    if ((local_58.span)->offsets[local_58.index] != 0xff) {
      uVar7 = ((ulong)((long)local_58.span - *(long *)(this + 0x20)) >> 4) * 0x1c71c71c71c71c80 |
              local_58.index;
      bVar3 = true;
      goto LAB_00392c59;
    }
  }
  uVar8 = *(ulong *)(this + 8);
  if (uVar7 >> 1 <= uVar8) {
    uVar9 = uVar8 + 1;
    if (uVar8 + 1 == 0) {
      uVar9 = uVar8;
    }
    numBuckets = 0x80;
    if ((0x40 < uVar9) && (numBuckets = 0xffffffffffffffff, uVar9 >> 0x3e == 0)) {
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar2 ^ 0x3f) & 0x3f);
    }
    lVar2 = *(long *)(this + 0x20);
    RVar13 = Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::allocateSpans
                       (numBuckets);
    *(Span **)(this + 0x20) = RVar13.spans;
    *(size_t *)(this + 0x10) = numBuckets;
    if (0x7f < uVar7) {
      uVar8 = 0;
      lVar11 = lVar2;
      do {
        lVar10 = uVar8 * 0x90 + lVar2;
        lVar12 = 0;
        do {
          if (*(byte *)(lVar11 + lVar12) != 0xff) {
            lVar4 = (ulong)*(byte *)(lVar11 + lVar12) * 0x10;
            local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
            uVar9 = *(ulong *)(this + 0x18) ^ *(ulong *)(*(long *)(lVar10 + 0x80) + lVar4);
            key_00 = (void **)(*(long *)(lVar10 + 0x80) + lVar4);
            uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
            uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
            local_48 = findBucketWithHash<void_const*>(this,key_00,uVar9 >> 0x20 ^ uVar9);
            pNVar5 = Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::
                     insert(&local_48);
            pvVar1 = key_00[1];
            pNVar5->key = *key_00;
            (pNVar5->value).pointer = pvVar1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x80);
        if (*(void **)(lVar10 + 0x80) != (void *)0x0) {
          operator_delete__(*(void **)(lVar10 + 0x80));
          *(undefined8 *)(lVar10 + 0x80) = 0;
        }
        uVar8 = uVar8 + 1;
        lVar11 = lVar11 + 0x90;
      } while (uVar8 != uVar7 >> 7);
    }
    if (lVar2 != 0) {
      lVar11 = *(long *)(lVar2 + -8);
      if (lVar11 != 0) {
        lVar10 = lVar11 * 0x90;
        do {
          pvVar1 = *(void **)(lVar2 + -0x10 + lVar10);
          if (pvVar1 != (void *)0x0) {
            operator_delete__(pvVar1);
            *(undefined8 *)(lVar2 + -0x10 + lVar10) = 0;
          }
          lVar10 = lVar10 + -0x90;
        } while (lVar10 != 0);
      }
      operator_delete__((void *)(lVar2 + -8),lVar11 * 0x90 + 8);
    }
    local_58 = findBucketWithHash<void_const*>(this,key,uVar6);
  }
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert(&local_58);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  uVar7 = ((ulong)((long)local_58.span - *(long *)(this + 0x20)) >> 4) * 0x1c71c71c71c71c80 |
          local_58.index;
  bVar3 = false;
LAB_00392c59:
  (__return_storage_ptr__->it).d =
       (Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)this;
  (__return_storage_ptr__->it).bucket = uVar7;
  __return_storage_ptr__->initialized = bVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }